

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

AssertionExpr *
slang::ast::bindAssertionBody
          (Symbol *symbol,SyntaxNode *syntax,ASTContext *context,SourceLocation outputLocalVarArgLoc
          ,AssertionInstanceDetails *instance,SmallVectorBase<const_slang::ast::Symbol_*> *localVars
          )

{
  group_type_pointer pgVar1;
  SymbolKind SVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  string_view name;
  string_view name_00;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uint64_t uVar12;
  Symbol *pSVar13;
  undefined4 extraout_var;
  Diagnostic *this_00;
  undefined4 extraout_var_00;
  SyntaxNode *pSVar14;
  undefined8 extraout_RDX;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined8 extraout_RDX_00;
  value_type_pointer ppVar18;
  ulong uVar19;
  LocalVariableDeclarationSyntax *pLVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  SyntaxNode **ppSVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  SourceRange sourceRange;
  LocalAssertionVarSymbol *var;
  iterator __end2;
  Scope *scope;
  SmallVector<const_slang::ast::LocalAssertionVarSymbol_*,_5UL> vars;
  try_emplace_args_t local_151;
  LocalVariableDeclarationSyntax *local_150;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_148;
  char *local_140;
  AssertionInstanceDetails *local_138;
  LocalVariableDeclarationSyntax *local_130;
  SyntaxNode *local_128;
  SyntaxNode *local_120;
  uint64_t local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  char *local_f8;
  SourceLocation local_f0;
  SyntaxNode *local_e8;
  Scope *local_e0;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_d8;
  locator local_d0;
  SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> local_b8 [2];
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  Symbol *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  AssertionExpr *this;
  
  SVar2 = symbol->kind;
  local_f0 = outputLocalVarArgLoc;
  local_d8 = localVars;
  local_60 = symbol;
  local_e0 = Symbol::scopeOrNull(symbol);
  local_148 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              &instance->localVars;
  pSVar14 = syntax[7].parent;
  local_e8 = (SyntaxNode *)(&pSVar14->kind + (long)syntax[7].previewNode * 2);
  uVar17 = extraout_RDX;
  local_138 = instance;
  local_130 = (LocalVariableDeclarationSyntax *)context;
  local_128 = syntax;
  if (SVar2 == Sequence) {
    while (pSVar14 != local_e8) {
      pLVar20 = *(LocalVariableDeclarationSyntax **)pSVar14;
      local_b8[0].data_ = (pointer)local_b8[0].firstElement;
      local_b8[0].len = 0;
      local_b8[0].cap = 5;
      local_120 = pSVar14;
      LocalAssertionVarSymbol::fromSyntax
                (*(Scope **)
                  &(((LocalVariableDeclarationSyntax *)context)->super_MemberSyntax).
                   super_SyntaxNode,pLVar20,local_b8);
      local_f8 = (char *)((long)local_b8[0].data_ + local_b8[0].len * 8);
      for (pcVar23 = (char *)local_b8[0].data_; pcVar23 != local_f8; pcVar23 = pcVar23 + 8) {
        local_150 = *(LocalVariableDeclarationSyntax **)pcVar23;
        pLVar20 = (LocalVariableDeclarationSyntax *)context;
        DeclaredType::forceResolveAt
                  ((DeclaredType *)
                   &(local_150->super_MemberSyntax).attributes.
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>,
                   context);
        phVar7 = local_148;
        if ((local_150->super_MemberSyntax).super_SyntaxNode.parent != (SyntaxNode *)0x0) {
          ppSVar24 = &(local_150->super_MemberSyntax).super_SyntaxNode.parent;
          local_140 = pcVar23;
          uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (local_148,(basic_string_view<char,_std::char_traits<char>_> *)ppSVar24
                             );
          uVar22 = uVar12 >> ((byte)*phVar7 & 0x3f);
          lVar15 = (uVar12 & 0xff) * 4;
          uVar27 = (&UNK_004a00ac)[lVar15];
          uVar28 = (&UNK_004a00ad)[lVar15];
          uVar29 = (&UNK_004a00ae)[lVar15];
          bVar30 = (&UNK_004a00af)[lVar15];
          uVar21 = (ulong)((uint)uVar12 & 7);
          uVar19 = 0;
          uVar16 = uVar22;
          uVar31 = uVar27;
          uVar32 = uVar28;
          uVar33 = uVar29;
          bVar34 = bVar30;
          uVar35 = uVar27;
          uVar36 = uVar28;
          uVar37 = uVar29;
          bVar38 = bVar30;
          uVar39 = uVar27;
          uVar40 = uVar28;
          uVar41 = uVar29;
          bVar42 = bVar30;
          do {
            pgVar3 = (instance->localVars).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                     .arrays.groups_;
            pgVar1 = pgVar3 + uVar16;
            local_58 = pgVar1->m[0].n;
            uStack_57 = pgVar1->m[1].n;
            uStack_56 = pgVar1->m[2].n;
            bStack_55 = pgVar1->m[3].n;
            uStack_54 = pgVar1->m[4].n;
            uStack_53 = pgVar1->m[5].n;
            uStack_52 = pgVar1->m[6].n;
            bStack_51 = pgVar1->m[7].n;
            uStack_50 = pgVar1->m[8].n;
            uStack_4f = pgVar1->m[9].n;
            uStack_4e = pgVar1->m[10].n;
            bStack_4d = pgVar1->m[0xb].n;
            uStack_4c = pgVar1->m[0xc].n;
            uStack_4b = pgVar1->m[0xd].n;
            uStack_4a = pgVar1->m[0xe].n;
            bVar9 = pgVar1->m[0xf].n;
            auVar25[0] = -(local_58 == uVar27);
            auVar25[1] = -(uStack_57 == uVar28);
            auVar25[2] = -(uStack_56 == uVar29);
            auVar25[3] = -(bStack_55 == bVar30);
            auVar25[4] = -(uStack_54 == uVar31);
            auVar25[5] = -(uStack_53 == uVar32);
            auVar25[6] = -(uStack_52 == uVar33);
            auVar25[7] = -(bStack_51 == bVar34);
            auVar25[8] = -(uStack_50 == uVar35);
            auVar25[9] = -(uStack_4f == uVar36);
            auVar25[10] = -(uStack_4e == uVar37);
            auVar25[0xb] = -(bStack_4d == bVar38);
            auVar25[0xc] = -(uStack_4c == uVar39);
            auVar25[0xd] = -(uStack_4b == uVar40);
            auVar25[0xe] = -(uStack_4a == uVar41);
            auVar25[0xf] = -(bVar9 == bVar42);
            uVar10 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
            bStack_49 = bVar9;
            if (uVar10 != 0) {
              ppVar4 = (instance->localVars).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.elements_;
              local_118 = uVar12;
              local_110 = uVar21;
              local_108 = uVar19;
              local_100 = uVar16;
              local_78 = uVar27;
              uStack_77 = uVar28;
              uStack_76 = uVar29;
              bStack_75 = bVar30;
              uStack_74 = uVar31;
              uStack_73 = uVar32;
              uStack_72 = uVar33;
              bStack_71 = bVar34;
              uStack_70 = uVar35;
              uStack_6f = uVar36;
              uStack_6e = uVar37;
              bStack_6d = bVar38;
              uStack_6c = uVar39;
              uStack_6b = uVar40;
              uStack_6a = uVar41;
              bStack_69 = bVar42;
              do {
                uVar6 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                ppVar18 = ppVar4 + uVar16 * 0xf + (ulong)uVar6;
                bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)local_148,
                                   (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                                   &ppVar18->first);
                context = (ASTContext *)local_130;
                if (bVar8) {
                  pLVar20 = local_150;
                  Scope::reportNameConflict
                            (*(Scope **)&(local_130->super_MemberSyntax).super_SyntaxNode,
                             (Symbol *)local_150,ppVar18->second);
                  instance = local_138;
                  pcVar23 = local_140;
                  goto LAB_00443cbb;
                }
                uVar10 = uVar10 - 1 & uVar10;
              } while (uVar10 != 0);
              bVar9 = pgVar3[uVar16].m[0xf].n;
              uVar16 = local_100;
              instance = local_138;
              uVar19 = local_108;
              uVar21 = local_110;
              uVar12 = local_118;
              uVar27 = local_78;
              uVar28 = uStack_77;
              uVar29 = uStack_76;
              bVar30 = bStack_75;
              uVar31 = uStack_74;
              uVar32 = uStack_73;
              uVar33 = uStack_72;
              bVar34 = bStack_71;
              uVar35 = uStack_70;
              uVar36 = uStack_6f;
              uVar37 = uStack_6e;
              bVar38 = bStack_6d;
              uVar39 = uStack_6c;
              uVar40 = uStack_6b;
              uVar41 = uStack_6a;
              bVar42 = bStack_69;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar21] & bVar9) == 0) break;
            uVar5 = (instance->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .arrays.groups_size_mask;
            lVar15 = uVar16 + uVar19;
            uVar19 = uVar19 + 1;
            uVar16 = lVar15 + 1U & uVar5;
          } while (uVar19 <= uVar5);
          if ((instance->localVars).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
              .size_ctrl.size <
              (instance->localVars).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                      (&local_d0,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        *)local_148,uVar22,uVar12,&local_151,
                       (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                       (LocalAssertionVarSymbol **)&local_150);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                      (&local_d0,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        *)local_148,uVar12,&local_151,
                       (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                       (LocalAssertionVarSymbol **)&local_150);
          }
          context = (ASTContext *)local_130;
          pcVar23 = local_140;
          local_d0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_150;
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)local_d8,(Symbol **)&local_d0);
          pLVar20 = (LocalVariableDeclarationSyntax *)
                    (local_150->super_MemberSyntax).super_SyntaxNode.parent;
          name._M_len = (size_t)(local_150->super_MemberSyntax).super_SyntaxNode.parent;
          name._M_str = (char *)(local_150->super_MemberSyntax).super_SyntaxNode.previewNode;
          pSVar13 = Scope::find(local_e0,name);
          if (pSVar13 != (Symbol *)0x0) {
            pLVar20 = local_150;
            Scope::reportNameConflict
                      (*(Scope **)
                        &(((LocalVariableDeclarationSyntax *)context)->super_MemberSyntax).
                         super_SyntaxNode,(Symbol *)local_150,pSVar13);
          }
        }
LAB_00443cbb:
      }
      SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::cleanup
                (local_b8,(EVP_PKEY_CTX *)pLVar20);
      pSVar14 = (SyntaxNode *)&local_120->parent;
    }
    iVar11 = AssertionExpr::bind((int)*(undefined8 *)(local_128 + 8),(sockaddr *)context,0);
    this = (AssertionExpr *)CONCAT44(extraout_var,iVar11);
    AssertionExpr::requireSequence(this,context);
    if ((((ulong)local_f0 & 0xfffffff) != 0) &&
       (AssertionExpr::checkNondegeneracy((NondegeneracyCheckResult *)local_b8,this),
       ((ulong)local_b8[0].data_ & 1) != 0)) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(local_128 + 8));
      this_00 = ASTContext::addDiag(context,(DiagCode)0x6c0007,sourceRange);
      Diagnostic::operator<<(this_00,local_60->name);
      Diagnostic::addNote(this_00,(DiagCode)0x50001,local_f0);
    }
  }
  else {
    while (pSVar14 != local_e8) {
      pLVar20 = *(LocalVariableDeclarationSyntax **)pSVar14;
      local_b8[0].data_ = (pointer)local_b8[0].firstElement;
      local_b8[0].len = 0;
      local_b8[0].cap = 5;
      local_120 = pSVar14;
      LocalAssertionVarSymbol::fromSyntax
                (*(Scope **)
                  &(((LocalVariableDeclarationSyntax *)context)->super_MemberSyntax).
                   super_SyntaxNode,pLVar20,local_b8);
      local_f8 = (char *)((long)local_b8[0].data_ + local_b8[0].len * 8);
      for (pcVar23 = (char *)local_b8[0].data_; pcVar23 != local_f8; pcVar23 = pcVar23 + 8) {
        local_150 = *(LocalVariableDeclarationSyntax **)pcVar23;
        pLVar20 = (LocalVariableDeclarationSyntax *)context;
        DeclaredType::forceResolveAt
                  ((DeclaredType *)
                   &(local_150->super_MemberSyntax).attributes.
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>,
                   context);
        phVar7 = local_148;
        if ((local_150->super_MemberSyntax).super_SyntaxNode.parent != (SyntaxNode *)0x0) {
          ppSVar24 = &(local_150->super_MemberSyntax).super_SyntaxNode.parent;
          local_140 = pcVar23;
          uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (local_148,(basic_string_view<char,_std::char_traits<char>_> *)ppSVar24
                             );
          uVar22 = uVar12 >> ((byte)*phVar7 & 0x3f);
          lVar15 = (uVar12 & 0xff) * 4;
          uVar27 = (&UNK_004a00ac)[lVar15];
          uVar28 = (&UNK_004a00ad)[lVar15];
          uVar29 = (&UNK_004a00ae)[lVar15];
          bVar30 = (&UNK_004a00af)[lVar15];
          uVar21 = (ulong)((uint)uVar12 & 7);
          uVar19 = 0;
          uVar16 = uVar22;
          uVar31 = uVar27;
          uVar32 = uVar28;
          uVar33 = uVar29;
          bVar34 = bVar30;
          uVar35 = uVar27;
          uVar36 = uVar28;
          uVar37 = uVar29;
          bVar38 = bVar30;
          uVar39 = uVar27;
          uVar40 = uVar28;
          uVar41 = uVar29;
          bVar42 = bVar30;
          do {
            pgVar3 = (instance->localVars).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                     .arrays.groups_;
            pgVar1 = pgVar3 + uVar16;
            local_48 = pgVar1->m[0].n;
            uStack_47 = pgVar1->m[1].n;
            uStack_46 = pgVar1->m[2].n;
            bStack_45 = pgVar1->m[3].n;
            uStack_44 = pgVar1->m[4].n;
            uStack_43 = pgVar1->m[5].n;
            uStack_42 = pgVar1->m[6].n;
            bStack_41 = pgVar1->m[7].n;
            uStack_40 = pgVar1->m[8].n;
            uStack_3f = pgVar1->m[9].n;
            uStack_3e = pgVar1->m[10].n;
            bStack_3d = pgVar1->m[0xb].n;
            uStack_3c = pgVar1->m[0xc].n;
            uStack_3b = pgVar1->m[0xd].n;
            uStack_3a = pgVar1->m[0xe].n;
            bVar9 = pgVar1->m[0xf].n;
            auVar26[0] = -(local_48 == uVar27);
            auVar26[1] = -(uStack_47 == uVar28);
            auVar26[2] = -(uStack_46 == uVar29);
            auVar26[3] = -(bStack_45 == bVar30);
            auVar26[4] = -(uStack_44 == uVar31);
            auVar26[5] = -(uStack_43 == uVar32);
            auVar26[6] = -(uStack_42 == uVar33);
            auVar26[7] = -(bStack_41 == bVar34);
            auVar26[8] = -(uStack_40 == uVar35);
            auVar26[9] = -(uStack_3f == uVar36);
            auVar26[10] = -(uStack_3e == uVar37);
            auVar26[0xb] = -(bStack_3d == bVar38);
            auVar26[0xc] = -(uStack_3c == uVar39);
            auVar26[0xd] = -(uStack_3b == uVar40);
            auVar26[0xe] = -(uStack_3a == uVar41);
            auVar26[0xf] = -(bVar9 == bVar42);
            uVar10 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
            bStack_39 = bVar9;
            if (uVar10 != 0) {
              ppVar4 = (instance->localVars).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.elements_;
              local_118 = uVar12;
              local_110 = uVar21;
              local_108 = uVar19;
              local_100 = uVar16;
              local_78 = uVar27;
              uStack_77 = uVar28;
              uStack_76 = uVar29;
              bStack_75 = bVar30;
              uStack_74 = uVar31;
              uStack_73 = uVar32;
              uStack_72 = uVar33;
              bStack_71 = bVar34;
              uStack_70 = uVar35;
              uStack_6f = uVar36;
              uStack_6e = uVar37;
              bStack_6d = bVar38;
              uStack_6c = uVar39;
              uStack_6b = uVar40;
              uStack_6a = uVar41;
              bStack_69 = bVar42;
              do {
                uVar6 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                ppVar18 = ppVar4 + uVar16 * 0xf + (ulong)uVar6;
                bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)local_148,
                                   (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                                   &ppVar18->first);
                context = (ASTContext *)local_130;
                if (bVar8) {
                  pLVar20 = local_150;
                  Scope::reportNameConflict
                            (*(Scope **)&(local_130->super_MemberSyntax).super_SyntaxNode,
                             (Symbol *)local_150,ppVar18->second);
                  instance = local_138;
                  pcVar23 = local_140;
                  goto LAB_00443f8c;
                }
                uVar10 = uVar10 - 1 & uVar10;
              } while (uVar10 != 0);
              bVar9 = pgVar3[uVar16].m[0xf].n;
              uVar16 = local_100;
              instance = local_138;
              uVar19 = local_108;
              uVar21 = local_110;
              uVar12 = local_118;
              uVar27 = local_78;
              uVar28 = uStack_77;
              uVar29 = uStack_76;
              bVar30 = bStack_75;
              uVar31 = uStack_74;
              uVar32 = uStack_73;
              uVar33 = uStack_72;
              bVar34 = bStack_71;
              uVar35 = uStack_70;
              uVar36 = uStack_6f;
              uVar37 = uStack_6e;
              bVar38 = bStack_6d;
              uVar39 = uStack_6c;
              uVar40 = uStack_6b;
              uVar41 = uStack_6a;
              bVar42 = bStack_69;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar21] & bVar9) == 0) break;
            uVar5 = (instance->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .arrays.groups_size_mask;
            lVar15 = uVar16 + uVar19;
            uVar19 = uVar19 + 1;
            uVar16 = lVar15 + 1U & uVar5;
          } while (uVar19 <= uVar5);
          if ((instance->localVars).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
              .size_ctrl.size <
              (instance->localVars).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                      (&local_d0,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        *)local_148,uVar22,uVar12,&local_151,
                       (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                       (LocalAssertionVarSymbol **)&local_150);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                      (&local_d0,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        *)local_148,uVar12,&local_151,
                       (basic_string_view<char,_std::char_traits<char>_> *)ppSVar24,
                       (LocalAssertionVarSymbol **)&local_150);
          }
          context = (ASTContext *)local_130;
          pcVar23 = local_140;
          local_d0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_150;
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)local_d8,(Symbol **)&local_d0);
          pLVar20 = (LocalVariableDeclarationSyntax *)
                    (local_150->super_MemberSyntax).super_SyntaxNode.parent;
          name_00._M_len = (size_t)(local_150->super_MemberSyntax).super_SyntaxNode.parent;
          name_00._M_str = (char *)(local_150->super_MemberSyntax).super_SyntaxNode.previewNode;
          pSVar13 = Scope::find(local_e0,name_00);
          if (pSVar13 != (Symbol *)0x0) {
            pLVar20 = local_150;
            Scope::reportNameConflict
                      (*(Scope **)
                        &(((LocalVariableDeclarationSyntax *)context)->super_MemberSyntax).
                         super_SyntaxNode,(Symbol *)local_150,pSVar13);
          }
        }
LAB_00443f8c:
      }
      SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::cleanup
                (local_b8,(EVP_PKEY_CTX *)pLVar20);
      uVar17 = extraout_RDX_00;
      pSVar14 = (SyntaxNode *)&local_120->parent;
    }
    iVar11 = AssertionExpr::bind((int)*(undefined8 *)(local_128 + 8),(sockaddr *)context,
                                 (socklen_t)uVar17);
    this = (AssertionExpr *)CONCAT44(extraout_var_00,iVar11);
  }
  return this;
}

Assistant:

static const AssertionExpr& bindAssertionBody(const Symbol& symbol, const SyntaxNode& syntax,
                                              const ASTContext& context,
                                              SourceLocation outputLocalVarArgLoc,
                                              AssertionInstanceDetails& instance,
                                              SmallVectorBase<const Symbol*>& localVars) {
    auto createLocals = [&](auto& syntaxType) {
        auto& scope = symbol.as<Scope>();
        for (auto varSyntax : syntaxType.variables) {
            SmallVector<const LocalAssertionVarSymbol*> vars;
            LocalAssertionVarSymbol::fromSyntax(*context.scope, *varSyntax, vars);
            for (auto var : vars) {
                var->getDeclaredType()->forceResolveAt(context);
                if (!var->name.empty()) {
                    auto [it, inserted] = instance.localVars.emplace(var->name, var);
                    if (inserted) {
                        localVars.push_back(var);

                        // If value successfully inserted then check LRM 16.10 section restriction:
                        // "It's illegal to declare a local variable if it is a formal argument of
                        // a sequence declaration."
                        if (auto other = scope.find(var->name))
                            context.scope->reportNameConflict(*var, *other);
                    }
                    else {
                        context.scope->reportNameConflict(*var, *it->second);
                    }
                }
            }
        }
    };

    if (symbol.kind == SymbolKind::Sequence) {
        auto& sds = syntax.as<SequenceDeclarationSyntax>();
        createLocals(sds);

        auto& result = AssertionExpr::bind(*sds.seqExpr, context);
        result.requireSequence(context);

        if (outputLocalVarArgLoc &&
            result.checkNondegeneracy().status.has(NondegeneracyStatus::AdmitsEmpty)) {
            auto& diag = context.addDiag(diag::LocalVarOutputEmptyMatch,
                                         sds.seqExpr->sourceRange());
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, outputLocalVarArgLoc);
        }

        return result;
    }
    else {
        auto& pds = syntax.as<PropertyDeclarationSyntax>();
        createLocals(pds);
        return AssertionExpr::bind(*pds.propertySpec, context);
    }
}